

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RawProgramWrapper::writeToLog
          (RawProgramWrapper *this,TestLog *log)

{
  qpShaderType type;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  allocator<char> local_d9;
  string local_d8;
  string info;
  LogShader local_98;
  undefined1 local_48 [40];
  
  std::__cxx11::string::string((string *)&info,(string *)&(this->m_program).m_info);
  type = glu::getLogShaderType(this->m_shaderType);
  local_48[0] = true;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)&info);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_48,(int)log,__buf,in_RCX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"[Shader created by glCreateShaderProgramv()]",&local_d9);
  __n = 1;
  tcu::LogShader::LogShader(&local_98,type,&this->m_source,true,&local_d8);
  tcu::LogShader::write(&local_98,(int)log,__buf_00,__n);
  tcu::TestLog::endShaderProgram(log);
  tcu::LogShader::~LogShader(&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)&info);
  return;
}

Assistant:

void RawProgramWrapper::writeToLog (TestLog& log)
{
	const string	info	= m_program.getInfoLog();
	qpShaderType	qpType	= glu::getLogShaderType(m_shaderType);

	log << TestLog::ShaderProgram(true, info)
		<< TestLog::Shader(qpType, m_source,
						   true, "[Shader created by glCreateShaderProgramv()]")
		<< TestLog::EndShaderProgram;
}